

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

App * __thiscall CLI::App::get_option_group(App *this,string *group_name)

{
  pointer psVar1;
  element_type *peVar2;
  __type _Var3;
  OptionNotFound *this_00;
  pointer psVar4;
  string local_40;
  
  psVar4 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar4 == psVar1) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_40,group_name);
      OptionNotFound::OptionNotFound(this_00,&local_40);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
    }
    peVar2 = (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((peVar2->name_)._M_string_length == 0) {
      _Var3 = ::std::operator==(&peVar2->group_,group_name);
      if (_Var3) {
        return (psVar4->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
    }
    psVar4 = psVar4 + 1;
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App *App::get_option_group(std::string group_name) const {
    for(const App_p &app : subcommands_) {
        if(app->name_.empty() && app->group_ == group_name) {
            return app.get();
        }
    }
    throw OptionNotFound(group_name);
}